

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SHA1_Hash *
Internal_FaceHash(ON_SHA1_Hash *__return_storage_ptr__,ON_SubDHashType hash_type,
                 ON_SubDFace *first_face,uint level_index,ON_SubDFaceIdIterator *fidit)

{
  uint uVar1;
  ON_SubDFace *pOVar2;
  ON_SubDFace *extraout_RDX;
  ON_SubDFace *extraout_RDX_00;
  ON_SubDFace *extraout_RDX_01;
  ON_SubDFace *pOVar3;
  ON_SubDFace *extraout_RDX_02;
  undefined7 in_register_00000031;
  ON_SHA1 sha1;
  ON_SHA1 OStack_a8;
  
  ON_SHA1::ON_SHA1(&OStack_a8);
  if ((int)CONCAT71(in_register_00000031,hash_type) != 0) {
    uVar1 = 0;
    pOVar3 = extraout_RDX;
    for (; first_face != (ON_SubDFace *)0x0; first_face = first_face->m_next_face) {
      if ((first_face->super_ON_SubDComponentBase).m_id < uVar1) {
        ON_SHA1::Reset(&OStack_a8);
        pOVar2 = ON_SubDFaceIdIterator::FirstFace(fidit);
        pOVar3 = extraout_RDX_01;
        while (pOVar2 != (ON_SubDFace *)0x0) {
          if ((((pOVar2->super_ON_SubDComponentBase).m_level == level_index) &&
              ((pOVar2->super_ON_SubDComponentBase).m_id != 0)) &&
             ((pOVar2->super_ON_SubDComponentBase).m_archive_id != 0xffffffff)) {
            Internal_AccumulateFaceHash(&OStack_a8,(ON_SubDHashType)pOVar2,pOVar3);
          }
          pOVar2 = ON_SubDFaceIdIterator::NextFace(fidit);
          pOVar3 = extraout_RDX_02;
        }
        break;
      }
      Internal_AccumulateFaceHash(&OStack_a8,(ON_SubDHashType)first_face,pOVar3);
      uVar1 = (first_face->super_ON_SubDComponentBase).m_id;
      pOVar3 = extraout_RDX_00;
    }
  }
  ON_SHA1::Hash(__return_storage_ptr__,&OStack_a8);
  return __return_storage_ptr__;
}

Assistant:

static const ON_SHA1_Hash Internal_FaceHash(ON_SubDHashType hash_type, const ON_SubDFace* first_face, unsigned int level_index, ON_SubDFaceIdIterator& fidit)
{
  ON_SHA1 sha1;
  if (ON_SubDHashType::Unset != hash_type)
  {
    unsigned prev_id = 0;
    for (const ON_SubDFace* f = first_face; nullptr != f; f = f->m_next_face)
    {
      if (prev_id > f->m_id)
      {
        // must use slower fidit to get consistent results when complex editing juggles vertex order
        sha1.Reset();
        for (f = fidit.FirstFace(); nullptr != f; f = fidit.NextFace())
        {
          if (level_index == f->SubdivisionLevel() && f->IsActive())
            Internal_AccumulateFaceHash(sha1, hash_type, f);
        }
        break;
      }
      Internal_AccumulateFaceHash(sha1, hash_type, f);
      prev_id = f->m_id;
    }
  }
  return sha1.Hash();
}